

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.hpp
# Opt level: O0

string * pstore::logger::to_string<long_long>
                   (string *__return_storage_ptr__,czstring message,longlong t)

{
  string local_40;
  longlong local_20;
  longlong t_local;
  czstring message_local;
  
  local_20 = t;
  t_local = (longlong)message;
  message_local = (czstring)__return_storage_ptr__;
  std::__cxx11::to_string(&local_40,t);
  std::operator+(__return_storage_ptr__,message,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

static std::string to_string (gsl::czstring const message, T const t) {
                return message + std::to_string (t);
            }